

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

int cookie_sort(void *p1,void *p2)

{
  long lVar1;
  long lVar2;
  size_t sVar3;
  ulong uVar4;
  bool bVar5;
  
  lVar1 = *p1;
  lVar2 = *p2;
  if (*(char **)(lVar1 + 0x50) == (char *)0x0) {
    sVar3 = 0;
  }
  else {
    sVar3 = strlen(*(char **)(lVar1 + 0x50));
  }
  if (*(char **)(lVar2 + 0x50) == (char *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = strlen(*(char **)(lVar2 + 0x50));
  }
  bVar5 = sVar3 < uVar4;
  if (sVar3 == uVar4) {
    if (*(char **)(lVar1 + 0x60) == (char *)0x0) {
      sVar3 = 0;
    }
    else {
      sVar3 = strlen(*(char **)(lVar1 + 0x60));
    }
    if (*(char **)(lVar2 + 0x60) == (char *)0x0) {
      uVar4 = 0;
    }
    else {
      uVar4 = strlen(*(char **)(lVar2 + 0x60));
    }
    bVar5 = sVar3 < uVar4;
    if (sVar3 == uVar4) {
      if (*(char **)(lVar1 + 0x40) == (char *)0x0) {
        sVar3 = 0;
      }
      else {
        sVar3 = strlen(*(char **)(lVar1 + 0x40));
      }
      if (*(char **)(lVar2 + 0x40) == (char *)0x0) {
        uVar4 = 0;
      }
      else {
        uVar4 = strlen(*(char **)(lVar2 + 0x40));
      }
      bVar5 = sVar3 < uVar4;
      if (sVar3 == uVar4) {
        bVar5 = *(uint *)(lVar1 + 0x70) < *(uint *)(lVar2 + 0x70);
      }
    }
  }
  return bVar5 - 1 | 1;
}

Assistant:

static int cookie_sort(const void *p1, const void *p2)
{
  const struct Cookie *c1 = *(const struct Cookie * const *)p1;
  const struct Cookie *c2 = *(const struct Cookie * const *)p2;
  size_t l1, l2;

  /* 1 - compare cookie path lengths */
  l1 = c1->path ? strlen(c1->path) : 0;
  l2 = c2->path ? strlen(c2->path) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1; /* avoid size_t <=> int conversions */

  /* 2 - compare cookie domain lengths */
  l1 = c1->domain ? strlen(c1->domain) : 0;
  l2 = c2->domain ? strlen(c2->domain) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1; /* avoid size_t <=> int conversions */

  /* 3 - compare cookie name lengths */
  l1 = c1->name ? strlen(c1->name) : 0;
  l2 = c2->name ? strlen(c2->name) : 0;

  if(l1 != l2)
    return (l2 > l1) ? 1 : -1;

  /* 4 - compare cookie creation time */
  return (c2->creationtime > c1->creationtime) ? 1 : -1;
}